

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

void __thiscall
Clasp::SharedContext::setConfiguration(SharedContext *this,Configuration *c,Type ownership)

{
  Config *this_00;
  Share SVar1;
  LogPtr pEVar2;
  uint uVar3;
  Configuration *pCVar4;
  SatPreParams *opts;
  SatPreprocessor *x;
  bool bVar5;
  uint32 i;
  undefined1 *x_00;
  ulong uVar6;
  bool bVar7;
  
  bVar7 = c != (Configuration *)0x0;
  x_00 = config_def_s;
  if (bVar7) {
    x_00 = (undefined1 *)c;
  }
  pEVar2 = this->progress_;
  if ((pEVar2 != (LogPtr)0x0) && (pEVar2->sys_ != 0)) {
    pEVar2->sys_ = 0;
  }
  bVar5 = bVar7 && ownership == Acquire;
  this_00 = &this->config_;
  uVar6 = (this->config_).ptr_;
  pCVar4 = (Configuration *)(uVar6 & 0xfffffffffffffffe);
  if ((Configuration *)x_00 == pCVar4) {
    if (bVar5 != (bool)((byte)uVar6 & 1)) {
      this_00->ptr_ = (ulong)pCVar4 | (ulong)bVar5;
    }
  }
  else {
    SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject>::reset(this_00,(Configuration *)x_00);
    uVar6 = this_00->ptr_;
    if (!bVar7 || ownership != Acquire) {
      uVar6 = uVar6 & 0xfffffffffffffffe;
      this_00->ptr_ = uVar6;
    }
    (**(code **)(*(long *)(uVar6 & 0xfffffffffffffffe) + 0x10))
              ((long *)(uVar6 & 0xfffffffffffffffe),this);
    opts = (SatPreParams *)
           (**(code **)(*(long *)((this->config_).ptr_ & 0xfffffffffffffffe) + 0x18))();
    setShareMode(this,*(byte *)(opts + 1) & (share_auto|share_all));
    uVar3 = (*(uint *)(opts + 1) & 0x20) << 0x12;
    SVar1 = this->share_;
    this->share_ = (Share)((uint)SVar1 & 0xff7fffff | uVar3);
    this->share_ = (Share)((uint)SVar1 & 0xfb7fffff | uVar3 | (*(uint *)(opts + 1) & 0x40) << 0x14);
    if (((this->satPrepro).ptr_ < 2) && (((ulong)*opts & 3) != 0)) {
      x = SatPreParams::create(opts);
      SingleOwnerPtr<Clasp::SatPreprocessor,_Clasp::DeleteObject>::reset(&this->satPrepro,x);
    }
    enableStats(this,*(uint *)(opts + 1) >> 3 & 3);
    for (uVar3 = 0; uVar3 != (this->solvers_).ebo_.size; uVar3 = uVar3 + 1) {
      Solver::resetConfig((this->solvers_).ebo_.buf[uVar3]);
    }
  }
  return;
}

Assistant:

void SharedContext::setConfiguration(Configuration* c, Ownership_t::Type ownership) {
	bool own = ownership == Ownership_t::Acquire;
	if (c == 0) { c = &config_def_s; own = false; }
	report(Event::subsystem_facade);
	if (config_.get() != c) {
		config_ = c;
		if (!own) config_.release();
		config_->prepare(*this);
		const ContextParams& opts = config_->context();
		setShareMode(static_cast<ContextParams::ShareMode>(opts.shareMode));
		setShortMode(static_cast<ContextParams::ShortMode>(opts.shortMode));
		share_.seed   = opts.seed;
		if (satPrepro.get() == 0 && opts.satPre.type != SatPreParams::sat_pre_no) {
			satPrepro.reset(SatPreParams::create(opts.satPre));
		}
		enableStats(opts.stats);
		// force update on next call to Solver::startInit()
		for (uint32 i = 0; i != solvers_.size(); ++i) {
			solvers_[i]->resetConfig();
		}
	}
	else if (own != config_.is_owner()) {
		if (own) config_.acquire();
		else     config_.release();
	}
}